

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

bool __thiscall deqp::sl::ShaderCase::execute(ShaderCase *this)

{
  Value *val;
  ostringstream *poVar1;
  bool bVar2;
  ExpectResult EVar3;
  DataType dataType;
  TextureFormat log;
  RenderContext *pRVar4;
  pointer pVVar5;
  _Alloc_hider __s;
  pointer pEVar6;
  pointer pfVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  GLenum GVar11;
  GLint GVar12;
  DataType DVar13;
  uint uVar14;
  undefined4 extraout_var;
  int *piVar15;
  size_t sVar16;
  TextureFormat *pTVar17;
  long lVar18;
  TestError *this_00;
  TextureFormat TVar19;
  Surface *surface_00;
  int iVar20;
  char *pcVar21;
  void *__buf;
  uint uVar22;
  long lVar23;
  char *__s_00;
  vector<float,_std::allocator<float>_> *this_01;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  void *data;
  int iVar27;
  int iVar28;
  pointer pVVar29;
  float fVar30;
  float fVar31;
  string attribPrefix;
  Surface surface;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  ProgramSources sources;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  Random rnd;
  ShaderProgram program;
  value_type local_388;
  Surface local_368;
  int local_344;
  int local_340;
  int local_33c;
  ulong local_338;
  value_type local_330;
  ShaderCase *local_300;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  GLint local_2e4;
  uint local_2e0;
  uint local_2dc;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_2d8;
  long local_2c0;
  undefined1 local_2b8 [8];
  TextureFormat local_2b0;
  undefined1 local_2a8 [8];
  undefined1 auStack_2a0 [16];
  undefined1 local_290 [8];
  undefined1 local_288 [72];
  ios_base local_240 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_228;
  undefined1 local_208 [208];
  pointer local_138;
  ulong local_130;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_128;
  deRandom local_110;
  ShaderProgram local_100;
  Functions *gl;
  undefined4 extraout_var_00;
  
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  piVar15 = (int *)CONCAT44(extraout_var_00,iVar9);
  dVar10 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_110,dVar10);
  iVar9 = *piVar15;
  local_344 = 0x80;
  if (iVar9 < 0x80) {
    local_344 = iVar9;
  }
  iVar20 = 0x80;
  if (piVar15[1] < 0x80) {
    iVar20 = piVar15[1];
  }
  dVar10 = deRandom_getUint32(&local_110);
  uVar24 = dVar10 % ((iVar9 - local_344) + 1U);
  iVar9 = piVar15[1];
  dVar10 = deRandom_getUint32(&local_110);
  uVar22 = dVar10 % ((iVar9 - iVar20) + 1U);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"ShaderCase::execute(): start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                  ,0x117);
  local_340 = iVar20;
  local_2e0 = uVar22;
  local_2dc = uVar24;
  (*gl->viewport)(uVar24,uVar22,local_344,iVar20);
  pRVar4 = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,(this->m_vertexSource)._M_dataplus._M_p,
             (allocator<char> *)&local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,(this->m_fragmentSource)._M_dataplus._M_p,
             (allocator<char> *)&local_2d8);
  local_208[0x10] = 0;
  local_208._17_8_ = 0;
  local_208._0_8_ = (pointer)0x0;
  local_208[8] = 0;
  local_208._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_2b8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8,&local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_2a0,&local_388);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar4,(ProgramSources *)local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_228);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2b8 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  bVar8 = ((*local_100.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start)->m_info).compileOk;
  bVar2 = ((*local_100.m_shaders[1].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start)->m_info).compileOk;
  glu::operator<<((TestLog *)log,&local_100);
  dVar10 = local_100.m_program.m_program;
  EVar3 = this->m_expectResult;
  if (EVar3 == EXPECT_PASS) {
    pcVar21 = (char *)0x0;
    if (local_100.m_program.m_info.linkOk == false) {
      pcVar21 = "expected shaders to compile and link properly, but failed to link.";
    }
    __s_00 = "expected shaders to compile and link properly, but failed to compile.";
LAB_00dae3ff:
    if ((bVar8 & bVar2) != 0) {
      __s_00 = pcVar21;
    }
    local_300 = this;
    if (__s_00 == (char *)0x0) {
      bVar8 = true;
      if (EVar3 == EXPECT_PASS) {
        (*gl->useProgram)(local_100.m_program.m_program);
        GVar11 = (*gl->getError)();
        glu::checkError(GVar11,"glUseProgram()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                        ,0x15d);
        GVar12 = (*gl->getAttribLocation)(dVar10,"dEQP_Position");
        if (GVar12 == -1) {
          local_2b8 = (undefined1  [8])local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"no location found for attribute \'dEQP_Position\'","");
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,(char *)local_2b8,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                     ,0x164);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pVVar29 = (this->m_valueBlocks).
                  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar9 = (int)((ulong)((long)(this->m_valueBlocks).
                                    super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar29) >> 5
                     );
        bVar8 = iVar9 < 1;
        if (0 < iVar9) {
          fVar30 = (float)local_340;
          fVar31 = ceilf(fVar30 * 0.0 + 1.0);
          local_2e8 = (int)fVar31;
          fVar30 = floorf(fVar30 + -0.5);
          local_2ec = (int)fVar30;
          fVar30 = (float)local_344;
          fVar31 = ceilf(fVar30 * 0.0 + 1.0);
          local_2f0 = (int)fVar31;
          fVar30 = floorf(fVar30 + -0.5);
          local_2f4 = (int)fVar30;
          lVar23 = 0;
          local_2e4 = GVar12;
          do {
            local_2c0 = lVar23;
            if (0 < pVVar29[lVar23].arrayLength) {
              pVVar29 = pVVar29 + lVar23;
              local_2f8 = (int)lVar23 + 1;
              iVar9 = 0;
              local_138 = pVVar29;
              do {
                local_338 = ((long)(pVVar29->values).
                                   super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pVVar29->values).
                                   super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x71c71c71c71c71c7;
                local_2d8.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
                local_2d8.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2d8.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::vector(&local_128,(long)(int)local_338,(allocator_type *)local_2b8);
                local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
                local_2a8 = (undefined1  [8])0x0;
                auStack_2a0._0_8_ = auStack_2a0._0_8_ & 0xffffffffffffff00;
                local_288._0_8_ = (pointer)0x8;
                local_288._8_4_ = 4;
                local_288._12_4_ = 4;
                local_288._16_4_ = R;
                local_288._24_8_ = execute::s_positions;
                local_2b0 = (TextureFormat)auStack_2a0;
                local_290._0_4_ = GVar12;
                std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                emplace_back<glu::VertexArrayBinding>(&local_2d8,(VertexArrayBinding *)local_2b8);
                if (local_2b0 != (TextureFormat)auStack_2a0) {
                  operator_delete((void *)local_2b0,(ulong)(auStack_2a0._0_8_ + 1));
                }
                if (0 < (int)(uint)local_338) {
                  local_338 = (ulong)((uint)local_338 & 0x7fffffff);
                  uVar26 = 0;
                  local_33c = 0;
                  do {
                    pVVar5 = (pVVar29->values).
                             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    __s._M_p = pVVar5[uVar26].valueName._M_dataplus._M_p;
                    dataType = pVVar5[uVar26].dataType;
                    local_130 = uVar26;
                    uVar22 = glu::getDataTypeScalarSize(dataType);
                    GVar11 = (*gl->getError)();
                    glu::checkError(GVar11,"before set uniforms",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                    ,0x17f);
                    val = pVVar5 + uVar26;
                    if (val->storageType == STORAGE_OUTPUT) {
                      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_330,"ref_","");
                      pTVar17 = (TextureFormat *)std::__cxx11::string::append((char *)&local_330);
                      local_2b8 = (undefined1  [8])local_2a8;
                      TVar19 = (TextureFormat)(pTVar17 + 2);
                      if (*pTVar17 == TVar19) {
                        local_2a8 = *(undefined1 (*) [8])TVar19;
                        auStack_2a0._0_8_ = pTVar17[3];
                      }
                      else {
                        local_2a8 = *(undefined1 (*) [8])TVar19;
                        local_2b8 = (undefined1  [8])*pTVar17;
                      }
                      local_2b0 = pTVar17[1];
                      *pTVar17 = TVar19;
                      pTVar17[1].order = R;
                      pTVar17[1].type = SNORM_INT8;
                      *(undefined1 *)&pTVar17[2].order = R;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_330._M_dataplus._M_p != &local_330.field_2) {
                        operator_delete(local_330._M_dataplus._M_p,
                                        local_330.field_2._M_allocated_capacity + 1);
                      }
                      setUniformValue(gl,dVar10,(string *)local_2b8,val,iVar9);
                      GVar11 = (*gl->getError)();
                      glu::checkError(GVar11,"set reference uniforms",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                      ,0x1c3);
                      if (local_2b8 != (undefined1  [8])local_2a8) {
                        operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                      }
                    }
                    else if (val->storageType == STORAGE_INPUT) {
                      this_01 = local_128.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_33c;
                      std::vector<float,_std::allocator<float>_>::resize
                                (this_01,(long)(int)(uVar22 * 4));
                      if ((dataType - TYPE_FLOAT < 4) ||
                         (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9)) {
                        iVar20 = 0;
                        iVar25 = 0;
                        do {
                          if (0 < (int)uVar22) {
                            pEVar6 = (val->elements).
                                     super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pfVar7 = (this_01->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_start;
                            uVar26 = (ulong)uVar22;
                            iVar27 = iVar9 * uVar22;
                            iVar28 = iVar20;
                            do {
                              *(Element *)(pfVar7 + iVar28) = pEVar6[iVar27];
                              iVar28 = iVar28 + 1;
                              iVar27 = iVar27 + 1;
                              uVar26 = uVar26 - 1;
                            } while (uVar26 != 0);
                          }
                          iVar25 = iVar25 + 1;
                          iVar20 = iVar20 + uVar22;
                        } while (iVar25 != 4);
                      }
                      else {
                        iVar20 = 0;
                        iVar25 = 0;
                        do {
                          if (0 < (int)uVar22) {
                            pEVar6 = (val->elements).
                                     super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            pfVar7 = (this_01->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_start;
                            uVar26 = (ulong)uVar22;
                            iVar27 = iVar9 * uVar22;
                            iVar28 = iVar20;
                            do {
                              pfVar7[iVar28] = (float)pEVar6[iVar27].int32;
                              iVar28 = iVar28 + 1;
                              iVar27 = iVar27 + 1;
                              uVar26 = uVar26 - 1;
                            } while (uVar26 != 0);
                          }
                          iVar25 = iVar25 + 1;
                          iVar20 = iVar20 + uVar22;
                        } while (iVar25 != 4);
                      }
                      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388);
                      if ((local_300->m_caseType == CASETYPE_FRAGMENT_ONLY) ||
                         (DVar13 = glu::getDataTypeScalarType(dataType), DVar13 != TYPE_FLOAT)) {
                        std::__cxx11::string::_M_replace
                                  ((ulong)&local_388,0,(char *)local_388._M_string_length,0x1cf1dc0)
                        ;
                      }
                      local_368._0_8_ = &local_368.m_pixels.m_cap;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_368,local_388._M_dataplus._M_p,
                                 (char *)(local_388._M_string_length +
                                         (long)local_388._M_dataplus._M_p));
                      std::__cxx11::string::append((char *)&local_368);
                      GVar12 = (*gl->getAttribLocation)(dVar10,(GLchar *)local_368._0_8_);
                      if (GVar12 == -1) {
                        poVar1 = (ostringstream *)(local_2b8 + 8);
                        local_2b8 = (undefined1  [8])log;
                        std::__cxx11::ostringstream::ostringstream(poVar1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"Warning: no location found for attribute \'",
                                   0x2a);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,(char *)local_368._0_8_,
                                   (long)local_368.m_pixels.m_ptr);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1)
                        ;
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_2b8,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream(poVar1);
                        std::ios_base::~ios_base(local_240);
                      }
                      else {
                        if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
                          uVar24 = glu::getDataTypeMatrixNumColumns(dataType);
                          uVar14 = glu::getDataTypeMatrixNumRows(dataType);
                          if (0 < (int)uVar24) {
                            uVar26 = (ulong)uVar24;
                            iVar20 = 0;
                            do {
                              local_288._24_8_ =
                                   (this_01->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start + iVar20;
                              local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
                              local_2a8 = (undefined1  [8])0x0;
                              auStack_2a0._0_8_ = auStack_2a0._0_8_ & 0xffffffffffffff00;
                              local_288._0_8_ = (pointer)0x8;
                              local_288._12_4_ = 4;
                              local_2b0 = (TextureFormat)auStack_2a0;
                              local_290._0_4_ = GVar12;
                              local_288._8_4_ = uVar14;
                              local_288._16_4_ = uVar22 * 4;
                              std::
                              vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                              ::emplace_back<glu::VertexArrayBinding>
                                        (&local_2d8,(VertexArrayBinding *)local_2b8);
                              if (local_2b0 != (TextureFormat)auStack_2a0) {
                                operator_delete((void *)local_2b0,(ulong)(auStack_2a0._0_8_ + 1));
                              }
                              iVar20 = iVar20 + uVar14;
                              GVar12 = GVar12 + 1;
                              uVar26 = uVar26 - 1;
                            } while (uVar26 != 0);
                          }
                        }
                        else {
                          local_288._24_8_ =
                               (this_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                          local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffff00000000);
                          local_2a8 = (undefined1  [8])0x0;
                          auStack_2a0._0_8_ = auStack_2a0._0_8_ & 0xffffffffffffff00;
                          local_288._0_8_ = (pointer)0x8;
                          local_288._12_4_ = 4;
                          local_288._16_4_ = R;
                          local_2b0 = (TextureFormat)auStack_2a0;
                          local_290._0_4_ = GVar12;
                          local_288._8_4_ = uVar22;
                          std::
                          vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ::emplace_back<glu::VertexArrayBinding>
                                    (&local_2d8,(VertexArrayBinding *)local_2b8);
                          if (local_2b0 != (TextureFormat)auStack_2a0) {
                            operator_delete((void *)local_2b0,(ulong)(auStack_2a0._0_8_ + 1));
                          }
                        }
                        GVar11 = (*gl->getError)();
                        glu::checkError(GVar11,"set vertex attrib array",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                        ,0x1bc);
                      }
                      if ((size_t *)local_368._0_8_ != &local_368.m_pixels.m_cap) {
                        operator_delete((void *)local_368._0_8_,local_368.m_pixels.m_cap + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_388._M_dataplus._M_p != &local_388.field_2) {
                        operator_delete(local_388._M_dataplus._M_p,
                                        local_388.field_2._M_allocated_capacity + 1);
                      }
                      local_33c = local_33c + 1;
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_2b8,__s._M_p,(allocator<char> *)&local_330);
                      setUniformValue(gl,dVar10,(string *)local_2b8,val,iVar9);
                      if (local_2b8 != (undefined1  [8])local_2a8) {
                        operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                      }
                      GVar11 = (*gl->getError)();
                      glu::checkError(GVar11,"set uniforms",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                      ,0x1c9);
                    }
                    uVar26 = local_130 + 1;
                    pVVar29 = local_138;
                  } while (uVar26 != local_338);
                }
                (*gl->clearColor)(0.0,0.0,0.0,1.0);
                this = local_300;
                (*gl->clear)(0x4000);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"clear buffer",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                ,0x1d0);
                local_2b8._0_4_ = R;
                local_2b8._4_4_ = UNORM_INT32;
                local_2b0.order = 1;
                local_2a8 = (undefined1  [8])execute::s_indices;
                glu::draw(this->m_renderCtx,local_100.m_program.m_program,
                          (int)((ulong)((long)local_2d8.
                                              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_2d8.
                                             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x33333333,
                          local_2d8.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_2b8,
                          (DrawUtilCallback *)0x0);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"draw",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                ,0x1d5);
                tcu::Surface::Surface(&local_368,local_344,local_340);
                poVar1 = (ostringstream *)(local_2b8 + 8);
                pRVar4 = this->m_renderCtx;
                local_330._M_dataplus._M_p = (pointer)0x300000008;
                data = (void *)local_368.m_pixels.m_cap;
                if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
                  data = local_368.m_pixels.m_ptr;
                }
                tcu::PixelBufferAccess::PixelBufferAccess
                          ((PixelBufferAccess *)local_2b8,(TextureFormat *)&local_330,
                           local_368.m_width,local_368.m_height,1,data);
                GVar12 = local_2e4;
                glu::readPixels(pRVar4,local_2dc,local_2e0,(PixelBufferAccess *)local_2b8);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"read pixels",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                ,0x1da);
                bVar8 = checkPixels(this,&local_368,local_2f0,local_2f4,local_2e8,local_2ec);
                if (bVar8) {
                  tcu::Surface::~Surface(&local_368);
                  std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::~vector(&local_128);
                  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                  ~vector(&local_2d8);
                }
                else {
                  local_2b8 = (undefined1  [8])log;
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"INCORRECT RESULT for (value block ",0x22);
                  std::ostream::operator<<(poVar1,local_2f8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of ",4);
                  std::ostream::operator<<
                            (poVar1,(int)((ulong)((long)(this->m_valueBlocks).
                                                                                                                
                                                  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(this->m_valueBlocks).
                                                                                                              
                                                  super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,", sub-case ",0xb);
                  std::ostream::operator<<(poVar1,iVar9 + 1);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," of ",4);
                  std::ostream::operator<<(poVar1,pVVar29->arrayLength);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"):",2);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_2b8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_240);
                  poVar1 = (ostringstream *)(local_2b8 + 8);
                  local_2b8 = (undefined1  [8])log;
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"Failing shader input/output values:",0x23);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_2b8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_240);
                  dumpValues(this,pVVar29,iVar9);
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Result","");
                  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_388,"Rendered result image","");
                  surface_00 = &local_368;
                  tcu::LogImage::LogImage
                            ((LogImage *)local_2b8,&local_330,&local_388,surface_00,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
                  tcu::LogImage::write((LogImage *)local_2b8,log.order,__buf,(size_t)surface_00);
                  if ((pointer)auStack_2a0._8_8_ != (pointer)(local_290 + 8)) {
                    operator_delete((void *)auStack_2a0._8_8_,(ulong)(local_288._0_8_ + 1));
                  }
                  if (local_2b8 != (undefined1  [8])local_2a8) {
                    operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_388._M_dataplus._M_p != &local_388.field_2) {
                    operator_delete(local_388._M_dataplus._M_p,
                                    local_388.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                  (*gl->useProgram)(0);
                  tcu::TestContext::setTestResult
                            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                             "Image comparison failed");
                  tcu::Surface::~Surface(&local_368);
                  std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::~vector(&local_128);
                  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                  ~vector(&local_2d8);
                  if (!bVar8) goto LAB_00dae4c2;
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < pVVar29->arrayLength);
            }
            lVar23 = local_2c0 + 1;
            pVVar29 = (this->m_valueBlocks).
                      super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar18 = (long)(int)((ulong)((long)(this->m_valueBlocks).
                                               super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pVVar29) >> 5);
            bVar8 = lVar18 <= lVar23;
          } while (lVar23 < lVar18);
        }
        (*gl->useProgram)(0);
        GVar11 = (*gl->getError)();
        glu::checkError(GVar11,"ShaderCase::execute(): end",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                        ,0x1f6);
      }
      goto LAB_00dae4c4;
    }
    poVar1 = (ostringstream *)(local_2b8 + 8);
    local_2b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: ",7);
    sVar16 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s_00,sVar16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_240);
    tcu::TestContext::setTestResult
              ((local_300->super_TestCase).super_TestNode.m_testCtx,
               QP_TEST_RESULT_QUALITY_WARNING -
               ((byte)(~bVar2 | local_100.m_program.m_info.linkOk |
                      ~bVar8 | local_300->m_expectResult != EXPECT_COMPILE_FAIL) & 1),__s_00);
  }
  else {
    if (EVar3 == EXPECT_COMPILE_FAIL) {
      pcVar21 = "expected compilation to fail, but both shaders compiled and link failed.";
      if (local_100.m_program.m_info.linkOk != false) {
        pcVar21 = "expected compilation to fail, but both shaders compiled correctly.";
      }
      __s_00 = (char *)0x0;
      goto LAB_00dae3ff;
    }
    if (EVar3 == EXPECT_LINK_FAIL) {
      pcVar21 = (char *)0x0;
      if (local_100.m_program.m_info.linkOk != false) {
        pcVar21 = "expected linking to fail, but passed.";
      }
      __s_00 = "expected linking to fail, but unable to compile.";
      goto LAB_00dae3ff;
    }
  }
LAB_00dae4c2:
  bVar8 = false;
LAB_00dae4c4:
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return bVar8;
}

Assistant:

bool ShaderCase::execute(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_renderCtx.getFunctions();

	// Compute viewport.
	const tcu::RenderTarget& renderTarget = m_renderCtx.getRenderTarget();
	de::Random				 rnd(deStringHash(getName()));
	int						 width				= deMin32(renderTarget.getWidth(), VIEWPORT_WIDTH);
	int						 height				= deMin32(renderTarget.getHeight(), VIEWPORT_HEIGHT);
	int						 viewportX			= rnd.getInt(0, renderTarget.getWidth() - width);
	int						 viewportY			= rnd.getInt(0, renderTarget.getHeight() - height);
	const int				 numVerticesPerDraw = 4;

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): start");

	// Setup viewport.
	gl.viewport(viewportX, viewportY, width, height);

	const float		   quadSize			  = 1.0f;
	static const float s_positions[4 * 4] = { -quadSize, -quadSize, 0.0f, 1.0f, -quadSize, +quadSize, 0.0f, 1.0f,
											  +quadSize, -quadSize, 0.0f, 1.0f, +quadSize, +quadSize, 0.0f, 1.0f };

	static const deUint16 s_indices[2 * 3] = { 0, 1, 2, 1, 3, 2 };

	// Setup program.
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexSource.c_str(), m_fragmentSource.c_str()));

	// Check that compile/link results are what we expect.
	bool		vertexOk   = program.getShaderInfo(SHADERTYPE_VERTEX).compileOk;
	bool		fragmentOk = program.getShaderInfo(SHADERTYPE_FRAGMENT).compileOk;
	bool		linkOk	 = program.getProgramInfo().linkOk;
	const char* failReason = DE_NULL;

	log << program;

	switch (m_expectResult)
	{
	case EXPECT_PASS:
		if (!vertexOk || !fragmentOk)
			failReason = "expected shaders to compile and link properly, but failed to compile.";
		else if (!linkOk)
			failReason = "expected shaders to compile and link properly, but failed to link.";
		break;

	case EXPECT_COMPILE_FAIL:
		if (vertexOk && fragmentOk && !linkOk)
			failReason = "expected compilation to fail, but both shaders compiled and link failed.";
		else if (vertexOk && fragmentOk)
			failReason = "expected compilation to fail, but both shaders compiled correctly.";
		break;

	case EXPECT_LINK_FAIL:
		if (!vertexOk || !fragmentOk)
			failReason = "expected linking to fail, but unable to compile.";
		else if (linkOk)
			failReason = "expected linking to fail, but passed.";
		break;

	default:
		DE_ASSERT(false);
		return false;
	}

	if (failReason != DE_NULL)
	{
		// \todo [2010-06-07 petri] These should be handled in the test case?
		log << TestLog::Message << "ERROR: " << failReason << TestLog::EndMessage;

		// If implementation parses shader at link time, report it as quality warning.
		if (m_expectResult == EXPECT_COMPILE_FAIL && vertexOk && fragmentOk && !linkOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, failReason);
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason);
		return false;
	}

	// Return if compile/link expected to fail.
	if (m_expectResult != EXPECT_PASS)
		return (failReason == DE_NULL);

	// Start using program.
	deUint32 programID = program.getProgram();
	gl.useProgram(programID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Fetch location for positions positions.
	int positionLoc = gl.getAttribLocation(programID, "dEQP_Position");
	if (positionLoc == -1)
	{
		string errStr = string("no location found for attribute 'dEQP_Position'");
		TCU_FAIL(errStr.c_str());
	}

	// Iterate all value blocks.
	for (int blockNdx = 0; blockNdx < (int)m_valueBlocks.size(); blockNdx++)
	{
		const ValueBlock& valueBlock = m_valueBlocks[blockNdx];

		// Iterate all array sub-cases.
		for (int arrayNdx = 0; arrayNdx < valueBlock.arrayLength; arrayNdx++)
		{
			int						   numValues = (int)valueBlock.values.size();
			vector<VertexArrayBinding> vertexArrays;

			int					   attribValueNdx = 0;
			vector<vector<float> > attribValues(numValues);

			vertexArrays.push_back(va::Float(positionLoc, 4, numVerticesPerDraw, 0, &s_positions[0]));

			// Collect VA pointer for inputs and set uniform values for outputs (refs).
			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const ShaderCase::Value& val		= valueBlock.values[valNdx];
				const char*				 valueName  = val.valueName.c_str();
				DataType				 dataType   = val.dataType;
				int						 scalarSize = getDataTypeScalarSize(val.dataType);

				GLU_EXPECT_NO_ERROR(gl.getError(), "before set uniforms");

				if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
				{
					// Replicate values four times.
					std::vector<float>& scalars = attribValues[attribValueNdx++];
					scalars.resize(numVerticesPerDraw * scalarSize);
					if (isDataTypeFloatOrVec(dataType) || isDataTypeMatrix(dataType))
					{
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
							for (int ndx						   = 0; ndx < scalarSize; ndx++)
								scalars[repNdx * scalarSize + ndx] = val.elements[arrayNdx * scalarSize + ndx].float32;
					}
					else
					{
						// convert to floats.
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
						{
							for (int ndx = 0; ndx < scalarSize; ndx++)
							{
								float v = (float)val.elements[arrayNdx * scalarSize + ndx].int32;
								DE_ASSERT(val.elements[arrayNdx * scalarSize + ndx].int32 == (int)v);
								scalars[repNdx * scalarSize + ndx] = v;
							}
						}
					}

					// Attribute name prefix.
					string attribPrefix = "";
					// \todo [2010-05-27 petri] Should latter condition only apply for vertex cases (or actually non-fragment cases)?
					if ((m_caseType == CASETYPE_FRAGMENT_ONLY) || (getDataTypeScalarType(dataType) != TYPE_FLOAT))
						attribPrefix = "a_";

					// Input always given as attribute.
					string attribName = attribPrefix + valueName;
					int	attribLoc  = gl.getAttribLocation(programID, attribName.c_str());
					if (attribLoc == -1)
					{
						log << TestLog::Message << "Warning: no location found for attribute '" << attribName << "'"
							<< TestLog::EndMessage;
						continue;
					}

					if (isDataTypeMatrix(dataType))
					{
						int numCols = getDataTypeMatrixNumColumns(dataType);
						int numRows = getDataTypeMatrixNumRows(dataType);
						DE_ASSERT(scalarSize == numCols * numRows);

						for (int i = 0; i < numCols; i++)
							vertexArrays.push_back(va::Float(attribLoc + i, numRows, numVerticesPerDraw,
															 static_cast<int>(scalarSize * sizeof(float)),
															 &scalars[i * numRows]));
					}
					else
					{
						DE_ASSERT(isDataTypeFloatOrVec(dataType) || isDataTypeIntOrIVec(dataType) ||
								  isDataTypeUintOrUVec(dataType) || isDataTypeBoolOrBVec(dataType));
						vertexArrays.push_back(va::Float(attribLoc, scalarSize, numVerticesPerDraw, 0, &scalars[0]));
					}

					GLU_EXPECT_NO_ERROR(gl.getError(), "set vertex attrib array");
				}
				else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
				{
					// Set reference value.
					string refName = string("ref_") + valueName;
					setUniformValue(gl, programID, refName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set reference uniforms");
				}
				else
				{
					DE_ASSERT(val.storageType == ShaderCase::Value::STORAGE_UNIFORM);
					setUniformValue(gl, programID, valueName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set uniforms");
				}
			}

			// Clear.
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear buffer");

			// Draw.
			draw(m_renderCtx, program.getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
				 pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			// Read back results.
			Surface surface(width, height);
			glu::readPixels(m_renderCtx, viewportX, viewportY, surface.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			float w	= s_positions[3];
			int   minY = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)height + 1.0f);
			int   maxY = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)height - 0.5f);
			int   minX = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)width + 1.0f);
			int   maxX = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)width - 0.5f);

			if (!checkPixels(surface, minX, maxX, minY, maxY))
			{
				log << TestLog::Message << "INCORRECT RESULT for (value block " << (blockNdx + 1) << " of "
					<< (int)m_valueBlocks.size() << ", sub-case " << arrayNdx + 1 << " of " << valueBlock.arrayLength
					<< "):" << TestLog::EndMessage;

				log << TestLog::Message << "Failing shader input/output values:" << TestLog::EndMessage;
				dumpValues(valueBlock, arrayNdx);

				// Dump image on failure.
				log << TestLog::Image("Result", "Rendered result image", surface);

				gl.useProgram(0);
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return false;
			}
		}
	}

	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): end");
	return true;
}